

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O2

void __thiscall
BamTools::Internal::BamStandardIndex::CalculateCandidateOffsets
          (BamStandardIndex *this,BaiReferenceSummary *refSummary,uint64_t *minOffset,
          set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
          *candidateBins,vector<long,_std::allocator<long>_> *offsets)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  int j;
  int iVar6;
  int32_t numAlignmentChunks;
  uint32_t binId;
  ulong local_58;
  _Rb_tree<unsigned_short,unsigned_short,std::_Identity<unsigned_short>,std::less<unsigned_short>,std::allocator<unsigned_short>>
  *local_50;
  _Base_ptr local_48;
  BaiReferenceSummary *local_40;
  const_iterator local_38;
  
  local_58 = refSummary->FirstBinFilePosition;
  iVar4 = 0;
  local_40 = refSummary;
  Seek(this,(int64_t *)&local_58,0);
  local_48 = &(candidateBins->_M_t)._M_impl.super__Rb_tree_header._M_header;
  local_50 = (_Rb_tree<unsigned_short,unsigned_short,std::_Identity<unsigned_short>,std::less<unsigned_short>,std::allocator<unsigned_short>>
              *)candidateBins;
  do {
    if (local_40->NumBins <= iVar4) {
      return;
    }
    ReadBinIntoBuffer(this,&binId,&numAlignmentChunks);
    local_58 = CONCAT62(local_58._2_6_,(undefined2)binId);
    local_38._M_node =
         (_Base_ptr)
         std::
         _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
         ::find(&candidateBins->_M_t,(key_type_conflict *)&local_58);
    if (local_38._M_node != local_48) {
      lVar5 = 8;
      for (iVar6 = 0;
          candidateBins =
               (set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> *)
               local_50, iVar6 < numAlignmentChunks; iVar6 = iVar6 + 1) {
        pcVar1 = (this->m_resources).Buffer;
        uVar2 = *(ulong *)(pcVar1 + lVar5);
        uVar3 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 |
                uVar2 << 0x38;
        if (this->m_isBigEndian == false) {
          uVar3 = uVar2;
        }
        if (*minOffset <= uVar3) {
          uVar2 = *(ulong *)(pcVar1 + lVar5 + -8);
          local_58 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                     (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                     (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
                     (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
          if (this->m_isBigEndian == false) {
            local_58 = uVar2;
          }
          std::vector<long,_std::allocator<long>_>::emplace_back<long>(offsets,(long *)&local_58);
        }
        lVar5 = lVar5 + 0x10;
      }
      std::
      _Rb_tree<unsigned_short,unsigned_short,std::_Identity<unsigned_short>,std::less<unsigned_short>,std::allocator<unsigned_short>>
      ::erase_abi_cxx11_(local_50,local_38);
      if (*(long *)((long)candidateBins + 0x28) == 0) {
        return;
      }
    }
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

void BamStandardIndex::CalculateCandidateOffsets(const BaiReferenceSummary& refSummary,
                                                 const uint64_t& minOffset,
                                                 set<uint16_t>& candidateBins,
                                                 vector<int64_t>& offsets)
{
    // seek to first bin
    Seek(refSummary.FirstBinFilePosition, SEEK_SET);

    // iterate over reference bins
    uint32_t binId;
    int32_t numAlignmentChunks;
    set<uint16_t>::iterator candidateBinIter;
    for ( int i = 0; i < refSummary.NumBins; ++i ) {

        // read bin contents (if successful, alignment chunks are now in m_buffer)
        ReadBinIntoBuffer(binId, numAlignmentChunks);

        // see if bin is a 'candidate bin'
        candidateBinIter = candidateBins.find(binId);

        // if not, move on to next bin
        if ( candidateBinIter == candidateBins.end() )
            continue;

        // otherwise, check bin's contents against for overlap
        else {

            size_t offset = 0;
            uint64_t chunkStart;
            uint64_t chunkStop;

            // iterate over alignment chunks
            for ( int j = 0; j < numAlignmentChunks; ++j ) {

                // read chunk start & stop from buffer
                memcpy((char*)&chunkStart, m_resources.Buffer+offset, sizeof(uint64_t));
                offset += sizeof(uint64_t);
                memcpy((char*)&chunkStop, m_resources.Buffer+offset, sizeof(uint64_t));
                offset += sizeof(uint64_t);

                // swap endian-ness if necessary
                if ( m_isBigEndian ) {
                    SwapEndian_64(chunkStart);
                    SwapEndian_64(chunkStop);
                }

                // store alignment chunk's start offset
                // if its stop offset is larger than our 'minOffset'
                if ( chunkStop >= minOffset )
                    offsets.push_back(chunkStart);
            }

            // 'pop' bin ID from candidate bins set
            candidateBins.erase(candidateBinIter);

            // quit if no more candidates
            if ( candidateBins.empty() )
                break;
        }
    }
}